

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# by_all.hpp
# Opt level: O0

tuple<int,_int>
burst::detail::
by_all_impl<0ul,1ul,burst::front_t,std::tuple<boost::iterator_range<boost::range_detail::integer_iterator<int>>const&,boost::iterator_range<boost::range_detail::integer_iterator<int>>&>>
          (_Tuple_impl<0UL,_int,_int> param_1,front_t *param_2,
          tuple<const_boost::iterator_range<boost::range_detail::integer_iterator<int>_>_&,_boost::iterator_range<boost::range_detail::integer_iterator<int>_>_&>
          *param_3)

{
  tuple<const_boost::iterator_range<boost::range_detail::integer_iterator<int>_>_&,_boost::iterator_range<boost::range_detail::integer_iterator<int>_>_&>
  *this;
  iterator_range<boost::range_detail::integer_iterator<int>_> *piVar1;
  reference local_30;
  reference local_2c;
  tuple<const_boost::iterator_range<boost::range_detail::integer_iterator<int>_>_&,_boost::iterator_range<boost::range_detail::integer_iterator<int>_>_&>
  *local_28;
  tuple<const_boost::iterator_range<boost::range_detail::integer_iterator<int>_>_&,_boost::iterator_range<boost::range_detail::integer_iterator<int>_>_&>
  *t_local;
  front_t *f_local;
  _Tuple_impl<0UL,_int,_int> local_10;
  
  local_28 = param_3;
  t_local = (tuple<const_boost::iterator_range<boost::range_detail::integer_iterator<int>_>_&,_boost::iterator_range<boost::range_detail::integer_iterator<int>_>_&>
             *)param_2;
  local_10 = param_1;
  piVar1 = std::
           get<0ul,boost::iterator_range<boost::range_detail::integer_iterator<int>>const&,boost::iterator_range<boost::range_detail::integer_iterator<int>>&>
                     (param_3);
  local_2c = front_t::operator()(param_2,piVar1);
  this = t_local;
  piVar1 = std::
           get<1ul,boost::iterator_range<boost::range_detail::integer_iterator<int>>const&,boost::iterator_range<boost::range_detail::integer_iterator<int>>&>
                     (local_28);
  local_30 = front_t::operator()((front_t *)this,piVar1);
  std::tuple<int,_int>::tuple<int,_int,_true>((tuple<int,_int> *)param_1,&local_2c,&local_30);
  return (tuple<int,_int>)param_1;
}

Assistant:

constexpr decltype(auto)
            by_all_impl (std::index_sequence<Indices...>, UnaryFunction & f, Tuple && t)
        {
            return
                std::tuple
                <
                    invoke_result_t
                    <
                        UnaryFunction &, std::tuple_element_t<Indices, std::decay_t<Tuple>>
                    >...
                >
                (
                    f(std::get<Indices>(std::forward<Tuple>(t)))...
                );
        }